

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DefUseManager::AnalyzeInstDef(DefUseManager *this,Instruction *inst)

{
  ulong uVar1;
  uint32_t uVar2;
  _Hash_node_base *p_Var3;
  mapped_type *ppIVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  uint32_t def_id;
  key_type local_14;
  
  uVar2 = 0;
  if (inst->has_result_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  if (uVar2 == 0) {
    ClearInst(this,inst);
    return;
  }
  uVar1 = (this->id_to_def_)._M_h._M_bucket_count;
  uVar5 = (ulong)uVar2 % uVar1;
  p_Var6 = (this->id_to_def_)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6, uVar2 != *(uint *)&p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, uVar2 == *(uint *)&p_Var3[1]._M_nxt)) goto LAB_00562809;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00562809:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var7->_M_nxt;
  }
  if (p_Var3 != (_Hash_node_base *)0x0) {
    ClearInst(this,(Instruction *)p_Var3[2]._M_nxt);
  }
  ppIVar4 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,&local_14);
  *ppIVar4 = inst;
  return;
}

Assistant:

void DefUseManager::AnalyzeInstDef(Instruction* inst) {
  const uint32_t def_id = inst->result_id();
  if (def_id != 0) {
    auto iter = id_to_def_.find(def_id);
    if (iter != id_to_def_.end()) {
      // Clear the original instruction that defining the same result id of the
      // new instruction.
      ClearInst(iter->second);
    }
    id_to_def_[def_id] = inst;
  } else {
    ClearInst(inst);
  }
}